

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CollateExpression::Deserialize(CollateExpression *this,Deserializer *deserializer)

{
  int iVar1;
  uint uVar2;
  _Head_base<0UL,_duckdb::CollateExpression_*,_false> this_00;
  pointer pCVar3;
  byte bVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  _Tuple_impl<0UL,_duckdb::CollateExpression_*,_std::default_delete<duckdb::CollateExpression>_>
  local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  undefined8 local_48;
  undefined1 local_40;
  
  this_00._M_head_impl = (CollateExpression *)operator_new(0x60);
  CollateExpression(this_00._M_head_impl);
  local_58.super__Head_base<0UL,_duckdb::CollateExpression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::CollateExpression_*,_false>)
       (_Head_base<0UL,_duckdb::CollateExpression_*,_false>)this_00._M_head_impl;
  pCVar3 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)&local_58);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child");
  bVar4 = (byte)iVar1;
  if (bVar4 == 0) {
    _Var5._M_head_impl =
         (pCVar3->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) goto LAB_005c5db7;
    bVar4 = 0;
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      _Var6._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_50,deserializer);
      _Var6._M_head_impl = local_50._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pCVar3->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var5._M_head_impl == (ParsedExpression *)0x0) {
      bVar4 = 1;
    }
    else {
LAB_005c5db7:
      (*((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar4);
  pCVar3 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"collation");
  if ((char)uVar2 == '\0') {
    local_48._0_1_ = INVALID;
    local_48._1_1_ = INVALID;
    local_48._2_6_ = 0;
    local_40 = 0;
    local_50._M_head_impl = (ParsedExpression *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar3->collation,(string *)&local_50);
    if (local_50._M_head_impl == (ParsedExpression *)&local_40) goto LAB_005c5e5e;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar3->collation,(string *)&local_50);
    if (local_50._M_head_impl == (ParsedExpression *)&local_40) goto LAB_005c5e5e;
  }
  operator_delete(local_50._M_head_impl);
LAB_005c5e5e:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58.super__Head_base<0UL,_duckdb::CollateExpression_*,_false>._M_head_impl
  ;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CollateExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CollateExpression>(new CollateExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadPropertyWithDefault<string>(201, "collation", result->collation);
	return std::move(result);
}